

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O0

DdApaDigit Cudd_ApaAdd(int digits,DdApaNumber a,DdApaNumber b,DdApaNumber sum)

{
  ulong local_38;
  DdApaDoubleDigit partial;
  int i;
  DdApaNumber sum_local;
  DdApaNumber b_local;
  DdApaNumber a_local;
  int digits_local;
  
  local_38 = 0;
  for (partial._4_4_ = digits + -1; -1 < partial._4_4_; partial._4_4_ = partial._4_4_ + -1) {
    local_38 = (ulong)(a[partial._4_4_] + b[partial._4_4_]) + (local_38 >> 0x20);
    sum[partial._4_4_] = (DdApaDigit)local_38;
  }
  return (DdApaDigit)(local_38 >> 0x20);
}

Assistant:

DdApaDigit
Cudd_ApaAdd(
  int  digits,
  DdApaNumber  a,
  DdApaNumber  b,
  DdApaNumber  sum)
{
    int i;
    DdApaDoubleDigit partial = 0;

    for (i = digits - 1; i >= 0; i--) {
        partial = a[i] + b[i] + DD_MSDIGIT(partial);
        sum[i] = (DdApaDigit) DD_LSDIGIT(partial);
    }
    return((DdApaDigit) DD_MSDIGIT(partial));

}